

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O2

void __thiscall OpenGLFrameBuffer::DoSetGamma(OpenGLFrameBuffer *this)

{
  WORD WVar1;
  int iVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  WORD gammaTable [768];
  WORD local_618 [256];
  WORD aWStack_418 [256];
  WORD aWStack_218 [260];
  
  if (((this->super_SDLGLFB).m_supportsGamma == true) &&
     ((vid_hwgamma.Value == 0 ||
      ((vid_hwgamma.Value == 2 &&
       (iVar2 = (*(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.
                  super_DObject._vptr_DObject[0x21])(this), (char)iVar2 != '\0')))))) {
    fVar7 = Gamma.Value;
    if (4.0 <= Gamma.Value) {
      fVar7 = 4.0;
    }
    if (fVar7 <= 0.1) {
      fVar7 = 0.1;
    }
    fVar8 = vid_contrast.Value;
    if (3.0 <= vid_contrast.Value) {
      fVar8 = 3.0;
    }
    fVar6 = vid_brightness.Value;
    if (0.8 <= vid_brightness.Value) {
      fVar6 = 0.8;
    }
    if (fVar6 <= -0.8) {
      fVar6 = -0.8;
    }
    if (fVar8 <= 0.1) {
      fVar8 = 0.1;
    }
    dVar4 = exp2(7.994353436858858 - (double)(1.0 / fVar7) * 7.994353436858858);
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      dVar5 = (double)(((float)(int)lVar3 + -127.0) * fVar8 + 127.0);
      if (fVar7 != 1.0) {
        dVar5 = pow(dVar5,(double)(1.0 / fVar7));
        dVar5 = dVar5 * dVar4;
      }
      dVar5 = (dVar5 + (double)(fVar6 * 128.0)) * 256.0;
      if (65535.0 <= dVar5) {
        dVar5 = 65535.0;
      }
      if (dVar5 <= 0.0) {
        dVar5 = 0.0;
      }
      WVar1 = (WORD)(int)dVar5;
      aWStack_218[lVar3] = WVar1;
      aWStack_418[lVar3] = WVar1;
      local_618[lVar3] = WVar1;
    }
    SDLGLFB::SetGammaTable(&this->super_SDLGLFB,local_618);
    this->HWGammaActive = true;
    return;
  }
  if (this->HWGammaActive == true) {
    SDLGLFB::ResetGammaTable(&this->super_SDLGLFB);
    this->HWGammaActive = false;
  }
  return;
}

Assistant:

void OpenGLFrameBuffer::DoSetGamma()
{
	bool useHWGamma = m_supportsGamma && ((vid_hwgamma == 0) || (vid_hwgamma == 2 && IsFullscreen()));
	if (useHWGamma)
	{
		WORD gammaTable[768];

		// This formula is taken from Doomsday
		float gamma = clamp<float>(Gamma, 0.1f, 4.f);
		float contrast = clamp<float>(vid_contrast, 0.1f, 3.f);
		float bright = clamp<float>(vid_brightness, -0.8f, 0.8f);

		double invgamma = 1 / gamma;
		double norm = pow(255., invgamma - 1);

		for (int i = 0; i < 256; i++)
		{
			double val = i * contrast - (contrast - 1) * 127;
			if(gamma != 1) val = pow(val, invgamma) / norm;
			val += bright * 128;

			gammaTable[i] = gammaTable[i + 256] = gammaTable[i + 512] = (WORD)clamp<double>(val*256, 0, 0xffff);
		}
		SetGammaTable(gammaTable);

		HWGammaActive = true;
	}
	else if (HWGammaActive)
	{
		ResetGammaTable();
		HWGammaActive = false;
	}
}